

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O2

Layer * __thiscall ModelWriter::create_custom_layer(ModelWriter *this,char *type)

{
  Layer *pLVar1;
  
  pLVar1 = ncnn::Net::create_custom_layer(&this->super_Net,type);
  if (pLVar1 != (Layer *)0x0) {
    return pLVar1;
  }
  fprintf(_stderr,"create_custom_layer %s\n",type);
  ncnn::Net::register_custom_layer
            (&this->super_Net,type,CustomLayer_layer_creator,(layer_destroyer_func)0x0,(void *)0x0);
  this->has_custom_layer = true;
  pLVar1 = ncnn::Net::create_custom_layer(&this->super_Net,type);
  return pLVar1;
}

Assistant:

ncnn::Layer* ModelWriter::create_custom_layer(const char* type)
{
    ncnn::Layer* layer = Net::create_custom_layer(type);
    if (layer)
        return layer;

    fprintf(stderr, "create_custom_layer %s\n", type);

    register_custom_layer(type, CustomLayer_layer_creator);

    has_custom_layer = true;

    return Net::create_custom_layer(type);
}